

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O0

void __thiscall Request::Request(Request *this,istream *stream)

{
  istream *piVar1;
  istream *in_RSI;
  string *in_RDI;
  string tmp;
  string local_30 [32];
  istream *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::__cxx11::string::string(local_30);
  piVar1 = std::operator>>(local_10,in_RDI);
  piVar1 = std::operator>>(piVar1,in_RDI + 0x20);
  piVar1 = std::operator>>(piVar1,in_RDI + 0x40);
  piVar1 = std::operator>>(piVar1,in_RDI + 0x60);
  std::operator>>(piVar1,in_RDI + 0x60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

Request::Request(std::istream& stream) {
    std::string tmp;
    stream >> method >> path >> protocol >> host >> host;
}